

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hpp
# Opt level: O1

List<Variant> * __thiscall Variant::toList(Variant *this)

{
  List<Variant> *local_10;
  
  if (this->data->type == listType) {
    return (List<Variant> *)(this->data + 1);
  }
  if (toList()::list != '\0') {
    return &toList::list;
  }
  toList();
  return local_10;
}

Assistant:

const List<Variant>& toList() const
  {
    if(data->type == listType)
      return *(const List<Variant>*)(data + 1);
    static const List<Variant> list;
    return list;
  }